

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QCalendarPopup::setCalendarWidget(QCalendarPopup *this,QCalendarWidget *cw)

{
  QObject *pQVar1;
  Data *pDVar2;
  QLayout *this_00;
  Data *pDVar3;
  long in_FS_OFFSET;
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QMargins local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::layout(&this->super_QWidget);
  this_00 = (QLayout *)QMetaObject::cast((QObject *)&QVBoxLayout::staticMetaObject);
  if (this_00 == (QLayout *)0x0) {
    this_00 = (QLayout *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout((QVBoxLayout *)this_00,&this->super_QWidget);
    local_38.m_left.m_i = 0;
    local_38.m_top.m_i = 0;
    local_38.m_right.m_i = 0;
    local_38.m_bottom.m_i = 0;
    QLayout::setContentsMargins(this_00,&local_38);
    (**(code **)(*(long *)this_00 + 0x68))(this_00,0);
  }
  pDVar3 = (this->calendar).wp.d;
  if (((pDVar3 != (Data *)0x0) && (*(int *)(pDVar3 + 4) != 0)) &&
     (pQVar1 = (this->calendar).wp.value, pQVar1 != (QObject *)0x0)) {
    (**(code **)(*(long *)pQVar1 + 0x20))();
  }
  if (cw == (QCalendarWidget *)0x0) {
    pDVar3 = (Data *)0x0;
  }
  else {
    pDVar3 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)cw);
  }
  pDVar2 = (this->calendar).wp.d;
  (this->calendar).wp.d = pDVar3;
  (this->calendar).wp.value = (QObject *)cw;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if (*(int *)pDVar2 == 0) {
      operator_delete(pDVar2);
    }
  }
  QBoxLayout::addWidget((QBoxLayout *)this_00,&cw->super_QWidget,0,(Alignment)0x0);
  QObject::connect(local_40,(char *)cw,(QObject *)"2activated(QDate)",(char *)this,0x6d4b57);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QObject::connect(local_48,(char *)cw,(QObject *)"2clicked(QDate)",(char *)this,0x6d4b57);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  QObject::connect(local_50,(char *)cw,(QObject *)"2selectionChanged()",(char *)this,0x6d4b80);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QWidget::setFocus(&cw->super_QWidget,OtherFocusReason);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarPopup::setCalendarWidget(QCalendarWidget *cw)
{
    Q_ASSERT(cw);
    QVBoxLayout *widgetLayout = qobject_cast<QVBoxLayout*>(layout());
    if (!widgetLayout) {
        widgetLayout = new QVBoxLayout(this);
        widgetLayout->setContentsMargins(QMargins());
        widgetLayout->setSpacing(0);
    }
    delete calendar.data();
    calendar = QPointer<QCalendarWidget>(cw);
    widgetLayout->addWidget(cw);

    connect(cw, SIGNAL(activated(QDate)), this, SLOT(dateSelected(QDate)));
    connect(cw, SIGNAL(clicked(QDate)), this, SLOT(dateSelected(QDate)));
    connect(cw, SIGNAL(selectionChanged()), this, SLOT(dateSelectionChanged()));

    cw->setFocus();
}